

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O3

result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
* __thiscall
toml::detail::
either<toml::detail::in_range<(char)16,(char)31>,toml::detail::character<(char)127>,toml::detail::repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>>>
::invoke<std::__cxx11::string>
          (result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
           *__return_storage_ptr__,
          either<toml::detail::in_range<(char)16,(char)31>,toml::detail::character<(char)127>,toml::detail::repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>>>
          *this,location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *loc)

{
  location<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *loc_00
  ;
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  rslt;
  result<toml::detail::region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::detail::none_t>
  local_68;
  
  in_range<(char)16,(char)31>::invoke<std::__cxx11::string>
            (&local_68,(in_range<(char)16,(char)31> *)this,loc);
  if (local_68.is_ok_ == true) {
    __return_storage_ptr__->is_ok_ = true;
    region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::region
              (&(__return_storage_ptr__->field_1).succ.value,&local_68.field_1.succ.value);
  }
  else {
    either<toml::detail::character<(char)127>,toml::detail::repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>>>
    ::invoke<std::__cxx11::string>
              (__return_storage_ptr__,
               (either<toml::detail::character<(char)127>,toml::detail::repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>>>
                *)this,loc_00);
  }
  if (local_68.is_ok_ == true) {
    region<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~region(&local_68.field_1.succ.value);
  }
  return __return_storage_ptr__;
}

Assistant:

static result<region<Cont>, none_t>
    invoke(location<Cont>& loc)
    {
        static_assert(std::is_same<char, typename Cont::value_type>::value,
                      "internal error: container::value_type should be `char`.");

        const auto rslt = Head::invoke(loc);
        if(rslt.is_ok()) {return rslt;}
        return either<Tail...>::invoke(loc);
    }